

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O1

string * __thiscall
pbrt::TaggedPointer<pbrt::TransformMapping3D>::ToString_abi_cxx11_
          (string *__return_storage_ptr__,TaggedPointer<pbrt::TransformMapping3D> *this)

{
  uint local_24;
  void *local_20;
  
  local_20 = (void *)(this->bits & 0xffffffffffff);
  local_24 = (uint)(ushort)(this->bits >> 0x30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<void_const*,unsigned_int>
            (__return_storage_ptr__,"[ TaggedPointer ptr: 0x%p tag: %d ]",&local_20,&local_24);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ TaggedPointer ptr: 0x%p tag: %d ]", ptr(), Tag());
    }